

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O2

bool __thiscall
ODDLParser::OpenDDLExport::writeValueArray(OpenDDLExport *this,DataArrayList *al,string *statement)

{
  Value *val;
  DataArrayList *pDVar1;
  Value **ppVVar2;
  string *this_00;
  long lVar3;
  bool bVar4;
  
  if ((al != (DataArrayList *)0x0) && (pDVar1 = al, al->m_numItems != 0)) {
    for (; pDVar1 != (DataArrayList *)0x0; pDVar1 = pDVar1->m_next) {
      this_00 = statement;
      std::__cxx11::string::append((char *)statement);
      lVar3 = 0;
      ppVVar2 = &pDVar1->m_dataList;
      while (val = *ppVVar2, val != (Value *)0x0) {
        bVar4 = lVar3 != 0;
        lVar3 = lVar3 + -1;
        if (bVar4) {
          this_00 = statement;
          std::__cxx11::string::append((char *)statement);
        }
        writeValue((OpenDDLExport *)this_00,val,statement);
        ppVVar2 = &val->m_next;
      }
      std::__cxx11::string::append((char *)statement);
    }
  }
  return al != (DataArrayList *)0x0;
}

Assistant:

bool OpenDDLExport::writeValueArray( DataArrayList *al, std::string &statement ) {
    if (ddl_nullptr == al) {
        return false;
    }

    if (0 == al->m_numItems) {
        return true;
    }

    DataArrayList *nextDataArrayList = al ;
    while (ddl_nullptr != nextDataArrayList) {
        if (ddl_nullptr != nextDataArrayList) {
            statement += "{ ";
            Value *nextValue( nextDataArrayList->m_dataList );
            size_t idx( 0 );
            while (ddl_nullptr != nextValue) {
                if (idx > 0) {
                    statement += ", ";
                }
                writeValue( nextValue, statement );
                nextValue = nextValue->m_next;
                idx++;
            }
            statement += " }";
        }
        nextDataArrayList = nextDataArrayList->m_next;
    }

    return true;
}